

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall cmCTest::AddTestsForDashboardType(cmCTest *this,string *targ)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)targ);
  if (iVar1 == 0) {
    this->InteractiveDebugMode = false;
    this->TestModel = 0;
    pcVar2 = "ExperimentalStart";
LAB_0025ee87:
    SetTest(this,pcVar2 + 0xc,true);
    SetTest(this,"Configure",true);
    SetTest(this,"Build",true);
    pcVar2 = "Test";
LAB_0025eec3:
    SetTest(this,pcVar2,true);
    SetTest(this,"Coverage",true);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025ef01:
      pcVar2 = "Start";
      goto LAB_0025ef8d;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025ef1e:
      pcVar2 = "Update";
      goto LAB_0025ef8d;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025ef38:
      pcVar2 = "Configure";
      goto LAB_0025ef8d;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025ef52:
      pcVar2 = "Build";
      goto LAB_0025ef8d;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025ef86:
      pcVar2 = "Test";
      goto LAB_0025ef8d;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)targ), iVar1 == 0)) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025ef6c:
      pcVar2 = "MemCheck";
      goto LAB_0025ef8d;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 == 0) {
      this->InteractiveDebugMode = false;
      this->TestModel = 0;
LAB_0025efb5:
      pcVar2 = "Coverage";
      goto LAB_0025ef8d;
    }
    iVar1 = std::__cxx11::string::compare((char *)targ);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
LAB_0025efe5:
        SetTest(this,"Start",true);
        pcVar2 = "ExperimentalUpdate";
        goto LAB_0025ee87;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025ef01;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025ef1e;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025ef38;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025ef52;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025ef86;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)targ), iVar1 == 0)) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025ef6c;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025efb5;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 2;
        goto LAB_0025eee4;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025efe5;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025ef01;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025ef1e;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025ef38;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025ef52;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025ef86;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)targ), iVar1 == 0)) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025ef6c;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025efb5;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        goto LAB_0025eee4;
      }
      iVar1 = std::__cxx11::string::compare((char *)targ);
      if (iVar1 == 0) {
        this->InteractiveDebugMode = false;
        this->TestModel = 0;
        pcVar2 = "ExperimentalStart";
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)targ);
        if (iVar1 != 0) {
          return false;
        }
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
        SetTest(this,"Start",true);
        pcVar2 = "ExperimentalUpdate";
      }
      SetTest(this,pcVar2 + 0xc,true);
      SetTest(this,"Configure",true);
      SetTest(this,"Build",true);
      pcVar2 = "MemCheck";
      goto LAB_0025eec3;
    }
    this->InteractiveDebugMode = false;
    this->TestModel = 0;
  }
LAB_0025eee4:
  pcVar2 = "Submit";
LAB_0025ef8d:
  SetTest(this,pcVar2,true);
  return true;
}

Assistant:

bool cmCTest::AddTestsForDashboardType(std::string &targ)
{
  if ( targ == "Experimental" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "ExperimentalStart" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    }
  else if ( targ == "ExperimentalUpdate" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Update");
    }
  else if ( targ == "ExperimentalConfigure" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Configure");
    }
  else if ( targ == "ExperimentalBuild" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Build");
    }
  else if ( targ == "ExperimentalTest" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Test");
    }
  else if ( targ == "ExperimentalMemCheck"
            || targ == "ExperimentalPurify" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("MemCheck");
    }
  else if ( targ == "ExperimentalCoverage" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Coverage");
    }
  else if ( targ == "ExperimentalSubmit" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Submit");
    }
  else if ( targ == "Continuous" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "ContinuousStart" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Start");
    }
  else if ( targ == "ContinuousUpdate" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Update");
    }
  else if ( targ == "ContinuousConfigure" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Configure");
    }
  else if ( targ == "ContinuousBuild" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Build");
    }
  else if ( targ == "ContinuousTest" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Test");
    }
  else if ( targ == "ContinuousMemCheck"
        || targ == "ContinuousPurify" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("MemCheck");
    }
  else if ( targ == "ContinuousCoverage" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Coverage");
    }
  else if ( targ == "ContinuousSubmit" )
    {
    this->SetTestModel(cmCTest::CONTINUOUS);
    this->SetTest("Submit");
    }
  else if ( targ == "Nightly" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("Test");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "NightlyStart" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    }
  else if ( targ == "NightlyUpdate" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Update");
    }
  else if ( targ == "NightlyConfigure" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Configure");
    }
  else if ( targ == "NightlyBuild" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Build");
    }
  else if ( targ == "NightlyTest" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Test");
    }
  else if ( targ == "NightlyMemCheck"
            || targ == "NightlyPurify" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("MemCheck");
    }
  else if ( targ == "NightlyCoverage" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Coverage");
    }
  else if ( targ == "NightlySubmit" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Submit");
    }
  else if ( targ == "MemoryCheck" )
    {
    this->SetTestModel(cmCTest::EXPERIMENTAL);
    this->SetTest("Start");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("MemCheck");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else if ( targ == "NightlyMemoryCheck" )
    {
    this->SetTestModel(cmCTest::NIGHTLY);
    this->SetTest("Start");
    this->SetTest("Update");
    this->SetTest("Configure");
    this->SetTest("Build");
    this->SetTest("MemCheck");
    this->SetTest("Coverage");
    this->SetTest("Submit");
    }
  else
    {
    return false;
    }
  return true;
}